

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_manipulate.c
# Opt level: O1

int light_subcapture(light_pcapng section,_func_light_boolean_light_pcapng *predicate,
                    light_pcapng *subcapture)

{
  light_pcapng pcapng;
  _light_pcapng *p_Var1;
  light_boolean lVar2;
  int iVar3;
  _light_pcapng *section_00;
  _light_pcapng *p_Var4;
  
  lVar2 = __is_section_header(section);
  if (lVar2 != LIGHT_FALSE) {
    section_00 = __copy_block(section,LIGHT_FALSE);
    p_Var1 = section_00;
    for (pcapng = section->next_block; pcapng != (light_pcapng)0x0; pcapng = pcapng->next_block) {
      lVar2 = (*predicate)(pcapng);
      p_Var4 = p_Var1;
      if (lVar2 != LIGHT_FALSE) {
        p_Var4 = __copy_block(pcapng,LIGHT_FALSE);
        p_Var1->next_block = p_Var4;
      }
      p_Var1 = p_Var4;
    }
    *subcapture = section_00;
    iVar3 = __validate_section(section_00);
    return iVar3;
  }
  light_subcapture_cold_1();
  return -1;
}

Assistant:

int light_subcapture(const light_pcapng section, light_boolean (*predicate)(const light_pcapng), light_pcapng *subcapture)
{
	if (__is_section_header(section) == 0) {
		PCAPNG_ERROR("Invalid section header");
		return LIGHT_INVALID_SECTION;
	}

	// Root section header is automatically included into the subcapture.
	light_pcapng root = __copy_block(section, LIGHT_FALSE);
	light_pcapng iterator = root;
	light_pcapng next_block = section->next_block;

	while (next_block != NULL) {
		// Predicate functions applies to all block types, including section header blocks.
		if (!!predicate(next_block) == LIGHT_TRUE) {
			iterator->next_block = __copy_block(next_block, LIGHT_FALSE);
			iterator = iterator->next_block;
		}
		next_block = next_block->next_block;
	}

	*subcapture = root;
	return __validate_section(*subcapture);

}